

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O1

unsigned_long PaUtil_ZeroOutput(PaUtilBufferProcessor *bp,unsigned_long frameCount)

{
  ulong uVar1;
  PaUtilChannelDescriptor *pPVar2;
  
  if (bp->hostOutputFrameCount[0] < frameCount) {
    frameCount = bp->hostOutputFrameCount[0];
  }
  if (bp->outputChannelCount != 0) {
    pPVar2 = bp->hostOutputChannels[0];
    uVar1 = 0;
    do {
      (*bp->outputZeroer)(pPVar2->data,pPVar2->stride,(uint)frameCount);
      pPVar2->data = (void *)((long)pPVar2->data +
                             (ulong)(pPVar2->stride * (uint)frameCount *
                                    bp->bytesPerHostOutputSample));
      uVar1 = uVar1 + 1;
      pPVar2 = pPVar2 + 1;
    } while (uVar1 < bp->outputChannelCount);
  }
  bp->hostOutputFrameCount[0] = bp->hostOutputFrameCount[0] + (frameCount & 0xffffffff);
  return frameCount & 0xffffffff;
}

Assistant:

unsigned long PaUtil_ZeroOutput( PaUtilBufferProcessor* bp, unsigned long frameCount )
{
    PaUtilChannelDescriptor *hostOutputChannels;
    unsigned int framesToZero;
    unsigned int i;

    hostOutputChannels = bp->hostOutputChannels[0];
    framesToZero = PA_MIN_( bp->hostOutputFrameCount[0], frameCount );

    for( i=0; i<bp->outputChannelCount; ++i )
    {
        bp->outputZeroer(   hostOutputChannels[i].data,
                            hostOutputChannels[i].stride,
                            framesToZero );


        /* advance dest ptr for next iteration */
        hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                framesToZero * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
    }

    bp->hostOutputFrameCount[0] += framesToZero;
    
    return framesToZero;
}